

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoThrow(Thread *this,Ptr *exn)

{
  uint uVar1;
  Store *store;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Exception *pEVar6;
  Ref RVar7;
  DefinedFunc *this_00;
  FuncDesc *pFVar8;
  vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *this_01;
  reference pCVar9;
  RefVec *this_02;
  const_reference pvVar10;
  reference pHVar11;
  Tag *this_03;
  TagType *pTVar12;
  Values *values;
  value_type local_140;
  reference local_138;
  Frame *target_frame;
  int local_124;
  size_t local_120;
  undefined1 local_118 [8];
  Ptr catch_tag;
  Ref catch_tag_ref;
  u32 uStack_f0;
  CatchDesc _catch;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *__range5;
  reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
  local_c8;
  reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
  local_c0;
  reference local_b8;
  HandlerDesc *handler;
  undefined1 local_a8 [8];
  reverse_iterator iter;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> handlers;
  u32 pc;
  undefined1 local_78 [8];
  Ptr func;
  Frame *frame;
  bool target_exnref;
  bool had_catch_all;
  bool popped_frame;
  undefined1 local_48 [8];
  Ptr exn_tag;
  u32 local_28;
  u32 target_exceptions;
  u32 target_values;
  Offset target_offset;
  Ptr *exn_local;
  Thread *this_local;
  
  target_exceptions = 0xffffffff;
  store = this->store_;
  pEVar6 = RefPtr<wabt::interp::Exception>::operator->(exn);
  RVar7 = Exception::tag(pEVar6);
  RefPtr<wabt::interp::Tag>::RefPtr((RefPtr<wabt::interp::Tag> *)local_48,store,RVar7);
  bVar5 = false;
  bVar3 = false;
  frame._5_1_ = 0;
  do {
    bVar4 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                      (&this->frames_);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      bVar5 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                        (&this->frames_);
      if (!bVar5) {
        __assert_fail("frames_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                      ,0xa92,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
      }
      this_local._4_4_ = Exception;
      local_124 = 1;
      goto LAB_00181d91;
    }
    func.root_index_ =
         (Index)std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                          (&this->frames_);
    RefPtr<wabt::interp::DefinedFunc>::RefPtr
              ((RefPtr<wabt::interp::DefinedFunc> *)local_78,this->store_,
               (Ref)(((reference)func.root_index_)->func).index);
    uVar1 = *(uint *)(func.root_index_ + 0x10);
    this_00 = RefPtr<wabt::interp::DefinedFunc>::operator->
                        ((RefPtr<wabt::interp::DefinedFunc> *)local_78);
    pFVar8 = DefinedFunc::desc(this_00);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &iter,&pFVar8->handlers);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rbegin
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               local_a8);
    while( true ) {
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rend
                ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                 &handler);
      bVar4 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                               *)local_a8,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                               *)&handler);
      if (!bVar4) break;
      local_b8 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                              *)local_a8);
      if ((local_b8->try_start_offset < uVar1) && (uVar1 <= local_b8->try_end_offset)) {
        if (local_b8->kind != Delegate) {
          this_01 = &local_b8->catches;
          __end5 = std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                   begin(this_01);
          _catch._4_8_ = std::
                         vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                         end(this_01);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
                                             *)&_catch.offset), bVar4) {
            pCVar9 = __gnu_cxx::
                     __normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
                     ::operator*(&__end5);
            uVar2._0_4_ = pCVar9->tag_index;
            uVar2._4_4_ = pCVar9->offset;
            _catch.tag_index = *(Index *)&pCVar9->ref;
            this_02 = Instance::tags(*(Instance **)(func.root_index_ + 0x18));
            pvVar10 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                                (this_02,uVar2 & 0xffffffff);
            local_120 = pvVar10->index;
            catch_tag.root_index_ = local_120;
            RefPtr<wabt::interp::Tag>::RefPtr
                      ((RefPtr<wabt::interp::Tag> *)local_118,this->store_,(Ref)local_120);
            bVar4 = interp::operator==((RefPtr<wabt::interp::Tag> *)local_48,
                                       (RefPtr<wabt::interp::Tag> *)local_118);
            if (bVar4) {
              target_exceptions = uVar2._4_4_;
              pHVar11 = std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                     *)local_a8);
              local_28 = pHVar11->values;
              pHVar11 = std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                     *)local_a8);
              exn_tag.root_index_._4_4_ = pHVar11->exceptions;
              frame._5_1_ = (byte)_catch.tag_index & 1;
              local_124 = 8;
            }
            else {
              local_124 = 0;
            }
            RefPtr<wabt::interp::Tag>::~RefPtr((RefPtr<wabt::interp::Tag> *)local_118);
            if (local_124 != 0) goto LAB_00181b97;
            __gnu_cxx::
            __normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
            ::operator++(&__end5);
          }
          if ((local_b8->field_4).catch_all_offset == 0xffffffff) goto LAB_00181b63;
          target_exceptions = (local_b8->field_4).catch_all_offset;
          pHVar11 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                 *)local_a8);
          local_28 = pHVar11->values;
          pHVar11 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                 *)local_a8);
          exn_tag.root_index_._4_4_ = pHVar11->exceptions;
          bVar3 = true;
          frame._5_1_ = local_b8->catch_all_ref & 1;
          local_124 = 8;
          goto LAB_00181b97;
        }
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rend
                  ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                   &__range5);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator-(&local_c8,(difference_type)&__range5);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator-(&local_c0,(difference_type)&local_c8);
      }
      else {
LAB_00181b63:
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                      *)&target_frame,(int)local_a8);
      }
    }
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::pop_back(&this->frames_)
    ;
    bVar5 = true;
    local_124 = 0;
LAB_00181b97:
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &iter);
    RefPtr<wabt::interp::DefinedFunc>::~RefPtr((RefPtr<wabt::interp::DefinedFunc> *)local_78);
  } while (local_124 == 0);
  if (local_124 == 8) {
    if (target_exceptions == 0xffffffff) {
      __assert_fail("target_offset != Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0xa96,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
    }
    local_138 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                          (&this->frames_);
    if (bVar5) {
      this->inst_ = local_138->inst;
      this->mod_ = local_138->mod;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,(ulong)(local_138->values + local_28));
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->exceptions_,(ulong)(local_138->exceptions + exn_tag.root_index_._4_4_));
    local_138->offset = target_exceptions;
    local_140.index = (size_t)RefPtr<wabt::interp::Exception>::ref(exn);
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
              (&this->exceptions_,&local_140);
    if (!bVar3) {
      this_03 = RefPtr<wabt::interp::Tag>::operator->((RefPtr<wabt::interp::Tag> *)local_48);
      pTVar12 = Tag::type(this_03);
      pEVar6 = RefPtr<wabt::interp::Exception>::operator->(exn);
      values = Exception::args(pEVar6);
      PushValues(this,&pTVar12->signature,values);
    }
    if (frame._5_1_ != 0) {
      RVar7 = RefPtr<wabt::interp::Exception>::ref(exn);
      Push(this,RVar7);
    }
    this_local._4_4_ = Ok;
    local_124 = 1;
  }
LAB_00181d91:
  RefPtr<wabt::interp::Tag>::~RefPtr((RefPtr<wabt::interp::Tag> *)local_48);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoThrow(Exception::Ptr exn) {
  Istream::Offset target_offset = Istream::kInvalidOffset;
  u32 target_values, target_exceptions;
  Tag::Ptr exn_tag{store_, exn->tag()};
  bool popped_frame = false;
  bool had_catch_all = false;
  bool target_exnref = false;

  // DoThrow is responsible for unwinding the stack at the point at which an
  // exception is thrown, and also branching to the appropriate catch within
  // the target try-catch. In a compiler, the tag dispatch might be done in
  // generated code in a landing pad, but this is easier for the interpreter.
  while (!frames_.empty()) {
    const Frame& frame = frames_.back();
    DefinedFunc::Ptr func{store_, frame.func};
    u32 pc = frame.offset;
    auto handlers = func->desc().handlers;

    // We iterate in reverse order, in order to traverse handlers from most
    // specific (pushed last) to least specific within a nested stack of
    // try-catch blocks.
    auto iter = handlers.rbegin();
    while (iter != handlers.rend()) {
      const HandlerDesc& handler = *iter;
      // pc points to the *next* instruction by the time we're in DoThrow.
      if (pc > handler.try_start_offset && pc <= handler.try_end_offset) {
        // For a try-delegate, skip part of the traversal by directly going
        // up to an outer handler specified by the delegate depth.
        if (handler.kind == HandlerKind::Delegate) {
          // Subtract one as we're trying to get a reverse iterator that is
          // offset by `delegate_handler_index` from the first item.
          iter = handlers.rend() - handler.delegate_handler_index - 1;
          continue;
        }
        // Otherwise, check for a matching catch tag or catch_all.
        for (auto _catch : handler.catches) {
          // Here we have to be careful to use the target frame's instance
          // to look up the tag rather than the throw's instance.
          Ref catch_tag_ref = frame.inst->tags()[_catch.tag_index];
          Tag::Ptr catch_tag{store_, catch_tag_ref};
          if (exn_tag == catch_tag) {
            target_offset = _catch.offset;
            target_values = (*iter).values;
            target_exceptions = (*iter).exceptions;
            target_exnref = _catch.ref;
            goto found_handler;
          }
        }
        if (handler.catch_all_offset != Istream::kInvalidOffset) {
          target_offset = handler.catch_all_offset;
          target_values = (*iter).values;
          target_exceptions = (*iter).exceptions;
          had_catch_all = true;
          target_exnref = handler.catch_all_ref;
          goto found_handler;
        }
      }
      iter++;
    }
    frames_.pop_back();
    popped_frame = true;
  }

  // If the call frames are empty now, the exception is uncaught.
  assert(frames_.empty());
  return RunResult::Exception;

found_handler:
  assert(target_offset != Istream::kInvalidOffset);

  Frame& target_frame = frames_.back();
  // If the throw crosses call frames, we need to reset the state to that
  // call frame's values. The stack heights may need to be offset by the
  // handler's heights as we may be jumping into the middle of the function
  // code after some stack height changes.
  if (popped_frame) {
    inst_ = target_frame.inst;
    mod_ = target_frame.mod;
  }
  values_.resize(target_frame.values + target_values);
  exceptions_.resize(target_frame.exceptions + target_exceptions);
  // Jump to the handler.
  target_frame.offset = target_offset;
  // When an exception is caught, it needs to be tracked in a stack
  // to allow for rethrows. This stack is popped on leaving the try-catch
  // or by control instructions such as `br`.
  exceptions_.push_back(exn.ref());
  // Also push exception payload values if applicable.
  if (!had_catch_all) {
    PushValues(exn_tag->type().signature, exn->args());
  }
  if (target_exnref) {
    Push(exn.ref());
  }
  return RunResult::Ok;
}